

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

bool __thiscall MockSupport::expectedCallsLeft(MockSupport *this)

{
  bool bVar1;
  int iVar2;
  MockSupport *pMVar3;
  MockNamedValueListNode *local_20;
  MockNamedValueListNode *p;
  int callsLeft;
  MockSupport *this_local;
  
  bVar1 = MockExpectedCallsList::hasUnfulfilledExpectations(&this->expectations_);
  p._4_4_ = (uint)bVar1;
  for (local_20 = MockNamedValueList::begin(&this->data_); local_20 != (MockNamedValueListNode *)0x0
      ; local_20 = MockNamedValueListNode::next(local_20)) {
    pMVar3 = getMockSupport(this,local_20);
    if (pMVar3 != (MockSupport *)0x0) {
      pMVar3 = getMockSupport(this,local_20);
      iVar2 = (*pMVar3->_vptr_MockSupport[0x26])();
      p._4_4_ = ((byte)iVar2 & 1) + p._4_4_;
    }
  }
  return p._4_4_ != 0;
}

Assistant:

bool MockSupport::expectedCallsLeft()
{
    int callsLeft = expectations_.hasUnfulfilledExpectations();

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p)) callsLeft += getMockSupport(p)->expectedCallsLeft();

    return callsLeft != 0;
}